

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

DistantLight *
pbrt::DistantLight::Create
          (Transform *renderFromLight,ParameterDictionary *parameters,RGBColorSpace *colorSpace,
          FileLoc *loc,Allocator alloc)

{
  DistantLight *pDVar1;
  undefined1 auVar2 [16];
  Float FVar3;
  undefined1 extraout_var [60];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  Point3f PVar12;
  Float sc;
  Float k_e;
  SpectrumHandle L;
  Transform t;
  Transform finalRenderFromLight;
  float local_1ac;
  Float local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [7];
  undefined1 local_c8 [16];
  SpectrumHandle local_b0;
  ulong local_a8;
  Transform local_a0;
  undefined1 auVar7 [56];
  
  local_188._8_8_ = alloc.memoryResource;
  local_148._M_allocated_capacity = (size_type)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"L","");
  local_a8 = (ulong)&colorSpace->illuminant | 0x2000000000000;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)local_188,(string *)parameters,
             (SpectrumHandle *)&local_148._M_allocated_capacity,(SpectrumType)&local_a8,
             (Allocator)0x1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138[0]._M_allocated_capacity + 1);
  }
  local_148._M_allocated_capacity = (size_type)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"scale","");
  auVar4._0_4_ = ParameterDictionary::GetOneFloat(parameters,(string *)&local_148,1.0);
  auVar4._4_60_ = extraout_var;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != local_138) {
    local_1a8 = auVar4._0_4_;
    operator_delete((void *)local_148._M_allocated_capacity,local_138[0]._M_allocated_capacity + 1);
    auVar4 = ZEXT464((uint)local_1a8);
  }
  auVar7 = auVar4._8_56_;
  local_1ac = auVar4._0_4_;
  local_148._M_allocated_capacity = (size_type)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"from","");
  local_a0.m.m[0][0] = 0.0;
  local_a0.m.m[0][1] = 0.0;
  local_a0.m.m[0][2] = 0.0;
  PVar12 = ParameterDictionary::GetOnePoint3f(parameters,(string *)&local_148,(Point3f *)&local_a0);
  local_1a8 = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar7;
  local_198 = auVar5._0_16_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138[0]._M_allocated_capacity + 1);
  }
  local_148._M_allocated_capacity = (size_type)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"to","");
  local_a0.m.m[0][0] = 0.0;
  local_a0.m.m[0][1] = 0.0;
  local_a0.m.m[0][2] = 1.0;
  PVar12 = ParameterDictionary::GetOnePoint3f(parameters,(string *)&local_148,(Point3f *)&local_a0);
  auVar6._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar7;
  auVar8 = auVar6._0_16_;
  fVar10 = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != local_138) {
    local_178._0_4_ = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
    local_c8 = auVar6._0_16_;
    operator_delete((void *)local_148._M_allocated_capacity,local_138[0]._M_allocated_capacity + 1);
    auVar8 = local_c8;
    fVar10 = (float)local_178._0_4_;
  }
  auVar9 = vsubps_avx(local_198,auVar8);
  auVar8 = vmovshdup_avx(auVar9);
  local_1a8 = local_1a8 - fVar10;
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar8._0_4_)),auVar9,auVar9);
  auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)local_1a8),ZEXT416((uint)local_1a8));
  if (auVar2._0_4_ < 0.0) {
    local_198 = auVar9;
    local_178 = auVar8;
    local_a0.m.m[2][2] = sqrtf(auVar2._0_4_);
    auVar9 = local_198;
    auVar8 = local_178;
  }
  else {
    auVar2 = vsqrtss_avx(auVar2,auVar2);
    local_a0.m.m[2][2] = auVar2._0_4_;
  }
  local_a0.m.m[0][2] = auVar9._0_4_ / local_a0.m.m[2][2];
  local_a0.m.m[1][2] = auVar8._0_4_ / local_a0.m.m[2][2];
  auVar9._8_4_ = 0x3f800000;
  auVar9._0_8_ = 0x3f8000003f800000;
  auVar9._12_4_ = 0x3f800000;
  local_a0.m.m[2][2] = local_1a8 / local_a0.m.m[2][2];
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar2 = vpternlogd_avx512vl(auVar9,ZEXT416((uint)local_a0.m.m[2][2]),auVar2,0xf8);
  fVar10 = auVar2._0_4_;
  fVar11 = -1.0 / (local_a0.m.m[2][2] + fVar10);
  local_a0.m.m[0][1] = local_a0.m.m[0][2] * local_a0.m.m[1][2] * fVar11;
  auVar9 = vfmadd213ss_fma(ZEXT416((uint)(local_a0.m.m[0][2] * fVar10 * local_a0.m.m[0][2])),
                           ZEXT416((uint)fVar11),auVar9);
  local_a0.m.m[1][0] = fVar10 * local_a0.m.m[0][1];
  local_a0.m.m[2][0] = -fVar10 * local_a0.m.m[0][2];
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)(local_a0.m.m[1][2] * local_a0.m.m[1][2])),
                           ZEXT416((uint)fVar11),auVar2);
  local_a0.m.m[2][1] = -local_a0.m.m[1][2];
  local_1a8 = -local_a0.m.m[1][2];
  uStack_1a4 = auVar8._4_4_ ^ 0x80000000;
  uStack_1a0 = auVar8._8_4_ ^ 0x80000000;
  uStack_19c = auVar8._12_4_ ^ 0x80000000;
  local_a0.m.m[0][0] = auVar9._0_4_;
  local_a0.m.m[0][3] = 0.0;
  local_a0.m.m[1][1] = auVar2._0_4_;
  local_a0.m.m[1][3] = 0.0;
  local_a0.m.m._44_16_ = ZEXT816(0) << 0x20;
  local_a0.m.m[3][3] = 1.0;
  Transform::Transform((Transform *)&local_148,&local_a0.m);
  Transform::operator*(&local_a0,renderFromLight,(Transform *)&local_148);
  local_b0.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )local_188._0_8_;
  FVar3 = SpectrumToPhotometric(&local_b0);
  local_1ac = local_1ac / FVar3;
  local_168._0_8_ = (ParsedParameter *)(local_168 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"illuminance","");
  FVar3 = ParameterDictionary::GetOneFloat(parameters,(string *)local_168,-1.0);
  if ((ParsedParameter *)local_168._0_8_ != (ParsedParameter *)(local_168 + 0x10)) {
    local_198._0_4_ = FVar3;
    operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    FVar3 = (Float)local_198._0_4_;
  }
  if (0.0 < FVar3) {
    local_1ac = (FVar3 / local_1a8) * local_1ac;
  }
  pDVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::DistantLight,pbrt::Transform&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)(local_188 + 8),&local_a0,
                      (SpectrumHandle *)local_188,&local_1ac,
                      (polymorphic_allocator<std::byte> *)(local_188 + 8));
  return pDVar1;
}

Assistant:

DistantLight *DistantLight::Create(const Transform &renderFromLight,
                                   const ParameterDictionary &parameters,
                                   const RGBColorSpace *colorSpace, const FileLoc *loc,
                                   Allocator alloc) {
    SpectrumHandle L = parameters.GetOneSpectrum("L", &colorSpace->illuminant,
                                                 SpectrumType::General, alloc);
    Float sc = parameters.GetOneFloat("scale", 1);

    Point3f from = parameters.GetOnePoint3f("from", Point3f(0, 0, 0));
    Point3f to = parameters.GetOnePoint3f("to", Point3f(0, 0, 1));

    Vector3f w = Normalize(from - to);
    Vector3f v1, v2;
    CoordinateSystem(w, &v1, &v2);
    Float m[4][4] = {v1.x, v2.x, w.x, 0, v1.y, v2.y, w.y, 0,
                     v1.z, v2.z, w.z, 0, 0,    0,    0,   1};
    Transform t(m);
    Transform finalRenderFromLight = renderFromLight * t;

    // Scale the light spectrum to be equivalent to 1 nit
    sc /= SpectrumToPhotometric(L);

    // Adjust scale to meet target illuminance value
    // Like for IBLs we measure illuminance as incident on an upward-facing
    // patch.
    Float E_v = parameters.GetOneFloat("illuminance", -1);
    if (E_v > 0) {
        Float k_e = -w.y;
        sc *= E_v / k_e;
    }

    return alloc.new_object<DistantLight>(finalRenderFromLight, L, sc, alloc);
}